

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O0

int arkLsInitialize(void *arkode_mem)

{
  bool bVar1;
  int iVar2;
  SUNMatrix_ID SVar3;
  uint uVar4;
  SUNLinearSolver_Type SVar5;
  void *pvVar6;
  SUNMatrix p_Var7;
  void *in_RDI;
  int retval;
  ARKLsMassMem arkls_massmem;
  ARKLsMem arkls_mem;
  ARKodeMem ark_mem;
  SUNMatrix_ID in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  ARKodeMem *in_stack_ffffffffffffffd8;
  ARKodeMem *ark_mem_00;
  ARKLsMem in_stack_ffffffffffffffe0;
  ARKodeMem in_stack_ffffffffffffffe8;
  
  iVar2 = arkLs_AccessLMem(in_stack_ffffffffffffffe8,(char *)in_stack_ffffffffffffffe0,
                           in_stack_ffffffffffffffd8,
                           (ARKLsMem *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)
                          );
  if (iVar2 != 0) {
    return iVar2;
  }
  ark_mem_00 = (ARKodeMem *)0x0;
  if ((in_stack_ffffffffffffffe8->step_getmassmem != (ARKTimestepGetMassMemFn)0x0) &&
     (pvVar6 = (*in_stack_ffffffffffffffe8->step_getmassmem)(in_RDI), pvVar6 != (void *)0x0)) {
    iVar2 = arkLs_AccessMassMem(in_stack_ffffffffffffffe8,(char *)in_stack_ffffffffffffffe0,
                                ark_mem_00,(ARKLsMassMem *)CONCAT44(iVar2,in_stack_ffffffffffffffd0)
                               );
    if (iVar2 != 0) {
      return iVar2;
    }
    iVar2 = 0;
  }
  if (in_stack_ffffffffffffffe0->A == (SUNMatrix)0x0) {
    in_stack_ffffffffffffffe0->jacDQ = 0;
    in_stack_ffffffffffffffe0->jac = (ARKLsJacFn)0x0;
    in_stack_ffffffffffffffe0->J_data = (void *)0x0;
    in_stack_ffffffffffffffe0->user_linsys = 0;
    in_stack_ffffffffffffffe0->linsys = (ARKLsLinSysFn)0x0;
    in_stack_ffffffffffffffe0->A_data = (void *)0x0;
  }
  else if (in_stack_ffffffffffffffe0->user_linsys == 0) {
    in_stack_ffffffffffffffe0->linsys = arkLsLinSys;
    in_stack_ffffffffffffffe0->A_data = in_stack_ffffffffffffffe8;
    if (in_stack_ffffffffffffffe0->jacDQ != 0) {
      iVar2 = 0;
      if (in_stack_ffffffffffffffe0->A->ops->getid == (_func_SUNMatrix_ID_SUNMatrix *)0x0) {
        iVar2 = 1;
      }
      else {
        SVar3 = SUNMatGetID((SUNMatrix)(ulong)in_stack_ffffffffffffffd0);
        if ((SVar3 == SUNMATRIX_DENSE) ||
           (SVar3 = SUNMatGetID((SUNMatrix)CONCAT44(iVar2,in_stack_ffffffffffffffd0)),
           SVar3 == SUNMATRIX_BAND)) {
          in_stack_ffffffffffffffe0->jac = arkLsDQJac;
          in_stack_ffffffffffffffe0->J_data = in_stack_ffffffffffffffe8;
        }
        else {
          iVar2 = iVar2 + 1;
        }
      }
      if (iVar2 != 0) {
        arkProcessError(in_stack_ffffffffffffffe8,-3,"ARKLS","arkLsInitialize",
                        "No Jacobian constructor available for SUNMatrix type");
        in_stack_ffffffffffffffe0->last_flag = -3;
        return -3;
      }
      iVar2 = 0;
    }
    if (in_stack_ffffffffffffffe0->savedJ == (SUNMatrix)0x0) {
      p_Var7 = SUNMatClone((SUNMatrix)CONCAT44(iVar2,in_stack_ffffffffffffffd0));
      in_stack_ffffffffffffffe0->savedJ = p_Var7;
      if (in_stack_ffffffffffffffe0->savedJ == (SUNMatrix)0x0) {
        arkProcessError(in_stack_ffffffffffffffe8,-4,"ARKLS","arkLsInitialize",
                        "A memory request failed.");
        in_stack_ffffffffffffffe0->last_flag = -4;
        return -4;
      }
    }
  }
  if (ark_mem_00 != (ARKodeMem *)0x0) {
    if ((in_stack_ffffffffffffffe0->A == (SUNMatrix)0x0) != (ark_mem_00[2] == (ARKodeMem)0x0)) {
      arkProcessError(in_stack_ffffffffffffffe8,-3,"ARKLS","arkLsInitialize",
                      "Cannot combine NULL and non-NULL System and mass matrices");
      in_stack_ffffffffffffffe0->last_flag = -3;
      return -3;
    }
    if (in_stack_ffffffffffffffe0->A != (SUNMatrix)0x0) {
      bVar1 = (in_stack_ffffffffffffffe0->A->ops->getid == (_func_SUNMatrix_ID_SUNMatrix *)0x0) !=
              (*(long *)ark_mem_00[2]->uround == 0);
      uVar4 = (uint)bVar1;
      if (in_stack_ffffffffffffffe0->A->ops->getid != (_func_SUNMatrix_ID_SUNMatrix *)0x0) {
        in_stack_ffffffffffffffd0 =
             SUNMatGetID((SUNMatrix)(ulong)CONCAT14(bVar1,in_stack_ffffffffffffffd0));
        SVar3 = SUNMatGetID((SUNMatrix)CONCAT44(uVar4,in_stack_ffffffffffffffd0));
        if (in_stack_ffffffffffffffd0 != SVar3) {
          uVar4 = uVar4 + 1;
        }
      }
      if (uVar4 != 0) {
        arkProcessError(in_stack_ffffffffffffffe8,-3,"ARKLS","arkLsInitialize",
                        "System and mass matrices have incompatible types");
        in_stack_ffffffffffffffe0->last_flag = -3;
        return -3;
      }
      iVar2 = 0;
    }
    SVar5 = SUNLinSolGetType((SUNLinearSolver)0xeb00e6);
    if ((SVar5 == SUNLINEARSOLVER_MATRIX_EMBEDDED) &&
       (SVar5 = SUNLinSolGetType((SUNLinearSolver)0xeb00fc),
       SVar5 != SUNLINEARSOLVER_MATRIX_EMBEDDED)) {
      arkProcessError(in_stack_ffffffffffffffe8,-3,"ARKLS","arkLsInitialize",
                      "mismatched matrix-embedded LS types (system and mass must match)");
      in_stack_ffffffffffffffe0->last_flag = -3;
      return -3;
    }
    SVar5 = SUNLinSolGetType((SUNLinearSolver)0xeb0151);
    if ((SVar5 != SUNLINEARSOLVER_MATRIX_EMBEDDED) &&
       (SVar5 = SUNLinSolGetType((SUNLinearSolver)0xeb0167),
       SVar5 == SUNLINEARSOLVER_MATRIX_EMBEDDED)) {
      arkProcessError(in_stack_ffffffffffffffe8,-3,"ARKLS","arkLsInitialize",
                      "mismatched matrix-embedded LS types (system and mass must match)");
      in_stack_ffffffffffffffe0->last_flag = -3;
      return -3;
    }
  }
  arkLsInitializeCounters(in_stack_ffffffffffffffe0);
  if (in_stack_ffffffffffffffe0->jtimesDQ != 0) {
    in_stack_ffffffffffffffe0->jtsetup = (ARKLsJacTimesSetupFn)0x0;
    in_stack_ffffffffffffffe0->jtimes = arkLsDQJtimes;
    in_stack_ffffffffffffffe0->Jt_data = in_stack_ffffffffffffffe8;
  }
  if (((in_stack_ffffffffffffffe0->A == (SUNMatrix)0x0) &&
      (in_stack_ffffffffffffffe0->pset == (ARKLsPrecSetupFn)0x0)) &&
     (in_stack_ffffffffffffffe8->step_disablelsetup != (ARKTimestepDisableLSetup)0x0)) {
    (*in_stack_ffffffffffffffe8->step_disablelsetup)(in_RDI);
  }
  SVar5 = SUNLinSolGetType((SUNLinearSolver)0xeb0247);
  if (SVar5 == SUNLINEARSOLVER_MATRIX_EMBEDDED) {
    (*in_stack_ffffffffffffffe8->step_disablelsetup)(in_RDI);
    in_stack_ffffffffffffffe0->scalesol = 0;
  }
  iVar2 = SUNLinSolInitialize((SUNLinearSolver)CONCAT44(iVar2,in_stack_ffffffffffffffd0));
  in_stack_ffffffffffffffe0->last_flag = iVar2;
  return in_stack_ffffffffffffffe0->last_flag;
}

Assistant:

int arkLsInitialize(void* arkode_mem)
{
  ARKodeMem    ark_mem;
  ARKLsMem     arkls_mem;
  ARKLsMassMem arkls_massmem;
  int          retval;

  /* access ARKLsMem structure */
  retval = arkLs_AccessLMem(arkode_mem, "arkLsInitialize",
                            &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* access ARKLsMassMem (if applicable) */
  arkls_massmem = NULL;
  if (ark_mem->step_getmassmem != NULL)
    if (ark_mem->step_getmassmem(arkode_mem) != NULL) {
      retval = arkLs_AccessMassMem(arkode_mem, "arkLsInitialize",
                                   &ark_mem, &arkls_massmem);
      if (retval != ARK_SUCCESS)  return(retval);
    }

  /* Test for valid combinations of matrix & Jacobian routines: */
  if (arkls_mem->A != NULL) {

    /* Matrix-based case */

    if (!arkls_mem->user_linsys) {

      /* Internal linear system function, reset pointers (just in case) */
      arkls_mem->linsys = arkLsLinSys;
      arkls_mem->A_data = ark_mem;

      /* Check if an internal or user-supplied Jacobian function is used */
      if (arkls_mem->jacDQ) {

        /* Internal difference quotient Jacobian. Check that A is dense or band,
           otherwise return an error */
        retval = 0;
        if (arkls_mem->A->ops->getid) {

          if ( (SUNMatGetID(arkls_mem->A) == SUNMATRIX_DENSE) ||
               (SUNMatGetID(arkls_mem->A) == SUNMATRIX_BAND) ) {
            arkls_mem->jac    = arkLsDQJac;
            arkls_mem->J_data = ark_mem;
          } else {
            retval++;
          }

        } else {
          retval++;
        }
        if (retval) {
          arkProcessError(ark_mem, ARKLS_ILL_INPUT, "ARKLS", "arkLsInitialize",
                          "No Jacobian constructor available for SUNMatrix type");
          arkls_mem->last_flag = ARKLS_ILL_INPUT;
          return(ARKLS_ILL_INPUT);
        }
      }

      /* Allocate internally saved Jacobian if not already done */
      if (arkls_mem->savedJ == NULL) {
        arkls_mem->savedJ = SUNMatClone(arkls_mem->A);
        if (arkls_mem->savedJ == NULL) {
          arkProcessError(ark_mem, ARKLS_MEM_FAIL, "ARKLS",
                          "arkLsInitialize", MSG_LS_MEM_FAIL);
          arkls_mem->last_flag = ARKLS_MEM_FAIL;
          return(ARKLS_MEM_FAIL);
        }
      }

    } /* end matrix-based case */

  } else {

    /* Matrix-free case: ensure 'jac' and 'linsys' function pointers are NULL */
    arkls_mem->jacDQ  = SUNFALSE;
    arkls_mem->jac    = NULL;
    arkls_mem->J_data = NULL;

    arkls_mem->user_linsys = SUNFALSE;
    arkls_mem->linsys      = NULL;
    arkls_mem->A_data      = NULL;

  }


  /* Test for valid combination of system matrix and mass matrix (if applicable) */
  if (arkls_massmem) {

    /* A and M must both be NULL or non-NULL */
    if ( (arkls_mem->A==NULL) ^ (arkls_massmem->M==NULL) ) {
      arkProcessError(ark_mem, ARKLS_ILL_INPUT, "ARKLS", "arkLsInitialize",
                      "Cannot combine NULL and non-NULL System and mass matrices");
      arkls_mem->last_flag = ARKLS_ILL_INPUT;
      return(ARKLS_ILL_INPUT);
    }

    /* If A is non-NULL, A and M must have matching types (if accessible) */
    if (arkls_mem->A) {
      retval = 0;
      if ((arkls_mem->A->ops->getid==NULL) ^ (arkls_massmem->M->ops->getid==NULL))
        retval++;
      if (arkls_mem->A->ops->getid)
        if (SUNMatGetID(arkls_mem->A) != SUNMatGetID(arkls_massmem->M))
          retval++;
      if (retval) {
        arkProcessError(ark_mem, ARKLS_ILL_INPUT, "ARKLS", "arkLsInitialize",
                        "System and mass matrices have incompatible types");
        arkls_mem->last_flag = ARKLS_ILL_INPUT;
        return(ARKLS_ILL_INPUT);
      }
    }

    /* If either system or mass matrix solver is matrix-embedded, then both must be */
    if ((SUNLinSolGetType(arkls_mem->LS) == SUNLINEARSOLVER_MATRIX_EMBEDDED) &&
        (SUNLinSolGetType(arkls_massmem->LS) != SUNLINEARSOLVER_MATRIX_EMBEDDED)) {
      arkProcessError(ark_mem, ARKLS_ILL_INPUT, "ARKLS", "arkLsInitialize",
                      "mismatched matrix-embedded LS types (system and mass must match)");
      arkls_mem->last_flag = ARKLS_ILL_INPUT;
      return(ARKLS_ILL_INPUT);
    }
    if ((SUNLinSolGetType(arkls_mem->LS) != SUNLINEARSOLVER_MATRIX_EMBEDDED) &&
        (SUNLinSolGetType(arkls_massmem->LS) == SUNLINEARSOLVER_MATRIX_EMBEDDED)) {
      arkProcessError(ark_mem, ARKLS_ILL_INPUT, "ARKLS", "arkLsInitialize",
                      "mismatched matrix-embedded LS types (system and mass must match)");
      arkls_mem->last_flag = ARKLS_ILL_INPUT;
      return(ARKLS_ILL_INPUT);
    }
  }

  /* reset counters */
  arkLsInitializeCounters(arkls_mem);

  /* Set Jacobian-vector product related fields, based on jtimesDQ */
  if (arkls_mem->jtimesDQ) {
    arkls_mem->jtsetup = NULL;
    arkls_mem->jtimes  = arkLsDQJtimes;
    arkls_mem->Jt_data = ark_mem;
  }

  /* If A is NULL and psetup is not present, then arkLsSetup does
     not need to be called, so set the lsetup function to NULL (if possible) */
  if ( (arkls_mem->A == NULL) &&
       (arkls_mem->pset == NULL) &&
       (ark_mem->step_disablelsetup != NULL) )
    ark_mem->step_disablelsetup(arkode_mem);

  /* When using a matrix-embedded linear solver, disable lsetup call and solution scaling */
  if (SUNLinSolGetType(arkls_mem->LS) == SUNLINEARSOLVER_MATRIX_EMBEDDED) {
    ark_mem->step_disablelsetup(arkode_mem);
    arkls_mem->scalesol = SUNFALSE;
  }

  /* Call LS initialize routine, and return result */
  arkls_mem->last_flag = SUNLinSolInitialize(arkls_mem->LS);
  return(arkls_mem->last_flag);
}